

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.cpp
# Opt level: O2

void __thiscall gui::Theme::Theme(Theme *this,Gui *gui)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Theme = (_func_int **)&PTR__Theme_001db010;
  this->gui_ = gui;
  p_Var1 = &(this->styles_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->styles_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->styles_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->styles_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->styles_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->styles_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->styles_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Theme::Theme(const Gui& gui) :
    gui_(gui),
    styles_() {
}